

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void __thiscall
pbrt::StatsAccumulator::ReportRareCheck
          (StatsAccumulator *this,char *condition,Float maxFrequency,int64_t numTrue,int64_t total)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>_>_>
  *pmVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  Stats *pSVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  allocator<char> local_81;
  key_type local_80;
  Float local_5c;
  ulong local_58;
  ulong local_50;
  undefined4 local_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  pSVar6 = this->stats;
  local_5c = maxFrequency;
  local_50 = total;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,condition,(allocator<char> *)&local_44);
  local_58 = numTrue;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>_>_>
          ::find(&(pSVar6->rareChecks)._M_t,&local_80);
  pSVar6 = this->stats;
  paVar1 = &local_80.field_2;
  pmVar3 = &pSVar6->rareChecks;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    pSVar6 = this->stats;
  }
  if ((_Rb_tree_header *)iVar4._M_node == &(pmVar3->_M_t)._M_impl.super__Rb_tree_header) {
    uStack_40 = 0;
    uStack_3c = 0;
    uStack_38 = 0;
    uStack_34 = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,condition,&local_81);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>_>_>
             ::operator[](&pSVar6->rareChecks,&local_80);
    pmVar5->maxFrequency = local_5c;
    *(undefined4 *)((long)&pmVar5->total + 4) = uStack_34;
    *(ulong *)&pmVar5->field_0x4 = CONCAT44(uStack_40,local_44);
    *(ulong *)((long)&pmVar5->numTrue + 4) = CONCAT44(uStack_38,uStack_3c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    pSVar6 = this->stats;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,condition,(allocator<char> *)&local_44);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>_>_>
           ::operator[](&pSVar6->rareChecks,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_50;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_58;
  auVar7 = vpunpcklqdq_avx(auVar8,auVar7);
  auVar2._0_8_ = pmVar5->numTrue;
  auVar2._8_8_ = pmVar5->total;
  auVar2 = vpaddq_avx(auVar7,auVar2);
  pmVar5->numTrue = auVar2._0_8_;
  pmVar5->total = auVar2._8_8_;
  return;
}

Assistant:

void StatsAccumulator::ReportRareCheck(const char *condition, Float maxFrequency,
                                       int64_t numTrue, int64_t total) {
    if (stats->rareChecks.find(condition) == stats->rareChecks.end())
        stats->rareChecks[condition] = Stats::RareCheck(maxFrequency);
    Stats::RareCheck &rc = stats->rareChecks[condition];
    rc.numTrue += numTrue;
    rc.total += total;
}